

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateNamesValueInternal(xmlDocPtr doc,xmlChar *value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  xmlChar *cur;
  int len;
  undefined8 uStack_38;
  
  if (value == (xmlChar *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uStack_38 = in_RAX;
    iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)((long)&uStack_38 + 4));
    lVar4 = (long)uStack_38._4_4_;
    iVar1 = xmlIsDocNameStartChar(doc,iVar1);
    if (iVar1 != 0) {
      iVar1 = xmlStringCurrentChar
                        ((xmlParserCtxtPtr)0x0,value + lVar4,(int *)((long)&uStack_38 + 4));
      cur = value + lVar4 + uStack_38._4_4_;
      iVar2 = xmlIsDocNameChar(doc,iVar1);
      if (iVar2 != 0) {
        do {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
          iVar2 = xmlIsDocNameChar(doc,iVar1);
        } while (iVar2 != 0);
      }
      iVar2 = 0;
      while (iVar1 == 0x20) {
        do {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
        } while (iVar1 == 0x20);
        iVar1 = xmlIsDocNameStartChar(doc,iVar1);
        if (iVar1 == 0) {
          return 0;
        }
        do {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
          iVar3 = xmlIsDocNameChar(doc,iVar1);
        } while (iVar3 != 0);
      }
      if (iVar1 == 0) {
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlValidateNamesValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;

    if (!xmlIsDocNameStartChar(doc, val))
	return(0);

    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;
    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    /* Should not test IS_BLANK(val) here -- see erratum E20*/
    while (val == 0x20) {
	while (val == 0x20) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}

	if (!xmlIsDocNameStartChar(doc, val))
	    return(0);

	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;

	while (xmlIsDocNameChar(doc, val)) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
    }

    if (val != 0) return(0);

    return(1);
}